

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_cmp_int(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_20;
  mbedtls_mpi local_18;
  
  local_20 = -z;
  if (0 < z) {
    local_20 = z;
  }
  local_18.p = &local_20;
  local_18.s = (uint)(z >> 0x3f) | 1;
  local_18.n = 1;
  iVar1 = mbedtls_mpi_cmp_mpi(X,&local_18);
  return iVar1;
}

Assistant:

int mbedtls_mpi_cmp_int( const mbedtls_mpi *X, mbedtls_mpi_sint z )
{
    mbedtls_mpi Y;
    mbedtls_mpi_uint p[1];
    MPI_VALIDATE_RET( X != NULL );

    *p  = ( z < 0 ) ? -z : z;
    Y.s = ( z < 0 ) ? -1 : 1;
    Y.n = 1;
    Y.p = p;

    return( mbedtls_mpi_cmp_mpi( X, &Y ) );
}